

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_widgets.cpp
# Opt level: O2

QTouchEventWidgetSequence * __thiscall
QTest::QTouchEventWidgetSequence::press
          (QTouchEventWidgetSequence *this,int touchId,QPoint *pt,QWidget *widget)

{
  long lVar1;
  long *plVar2;
  QPoint QVar3;
  
  plVar2 = (long *)QTest::QTouchEventSequence::point((int)this);
  QVar3 = mapToScreen(this,widget,pt);
  lVar1 = *plVar2;
  *(double *)(lVar1 + 0x50) = (double)QVar3.xp.m_i.m_i;
  *(double *)(lVar1 + 0x58) = (double)QVar3.yp.m_i.m_i;
  *(undefined1 *)(lVar1 + 0xdc) = 1;
  return this;
}

Assistant:

QTouchEventWidgetSequence& QTouchEventWidgetSequence::press(int touchId, const QPoint &pt, QWidget *widget)
{
    auto &p = point(touchId);
    QMutableEventPoint::setGlobalPosition(p, mapToScreen(widget, pt));
    QMutableEventPoint::setState(p, QEventPoint::State::Pressed);
    return *this;
}